

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,int type)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  
  if (ctxt->attsSpecial == (xmlHashTablePtr)0x0) {
    pxVar2 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsSpecial = pxVar2;
    if (pxVar2 == (xmlHashTablePtr)0x0) goto LAB_0013682e;
  }
  iVar1 = xmlHashAdd2(ctxt->attsSpecial,fullname,fullattr,(void *)(ulong)(uint)type);
  if (-1 < iVar1) {
    return;
  }
LAB_0013682e:
  xmlCtxtErrMemory(ctxt);
  return;
}

Assistant:

static void
xmlAddSpecialAttr(xmlParserCtxtPtr ctxt,
		  const xmlChar *fullname,
		  const xmlChar *fullattr,
		  int type)
{
    if (ctxt->attsSpecial == NULL) {
        ctxt->attsSpecial = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsSpecial == NULL)
	    goto mem_error;
    }

    if (xmlHashAdd2(ctxt->attsSpecial, fullname, fullattr,
                    XML_INT_TO_PTR(type)) < 0)
        goto mem_error;
    return;

mem_error:
    xmlErrMemory(ctxt);
}